

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

void b_array::ordered_insert<MultiMap::Pair<std::__cxx11::string,std::__cxx11::string>>
               (Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *data,size_t *size,
               Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *entry)

{
  int iVar1;
  ulong pos;
  size_t index;
  
  pos = 0;
  if (*size != 0) {
    index = 0;
    do {
      Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](data,index);
      iVar1 = std::__cxx11::string::compare((string *)entry);
      index = index + 1;
      if (0 < iVar1) {
        pos = index & 0xffffffff;
      }
    } while (index < *size);
    pos = (ulong)(int)pos;
  }
  insert_item<MultiMap::Pair<std::__cxx11::string,std::__cxx11::string>>(data,pos,size,entry);
  return;
}

Assistant:

void ordered_insert(b_array::Array<T>& data, size_t& size, const T& entry) {
    int pos = 0;
    for (size_t i = 0; i < size; i++) {
        if (entry > data[i]) {
            pos = i + 1;
        }
    }
    insert_item(data, pos, size, entry);
}